

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O1

void vkt::api::anon_unknown_0::createImageFormatTypeTilingTests
               (TestCaseGroup *testGroup,ImageFormatPropertyCase params)

{
  TestContext *testCtx;
  char *__s;
  TestNode *node;
  VkFormat value;
  string caseName;
  allocator<char> local_99;
  TestNode *local_98;
  string local_90;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  value = VK_FORMAT_R4G4_UNORM_PACK8;
  local_98 = &testGroup->super_TestNode;
  do {
    __s = ::vk::getFormatName(value);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_99);
    std::__cxx11::string::substr((ulong)&local_90,(ulong)local_50);
    de::toLower(&local_70,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,__s,(allocator<char> *)local_50);
    testCtx = local_98->m_testCtx;
    node = (TestNode *)operator_new(0x98);
    tcu::TestCase::TestCase
              ((TestCase *)node,testCtx,NODETYPE_SELF_VALIDATE,local_70._M_dataplus._M_p,
               local_90._M_dataplus._M_p);
    node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d1edc8;
    node[1].m_testCtx = (TestContext *)execImageFormatTest;
    node[1].m_name._M_dataplus._M_p = (pointer)params.testFunction;
    node[1].m_name._M_string_length = CONCAT44(params.imageType,value);
    node[1].m_name.field_2._M_allocated_capacity = params._16_8_;
    tcu::TestNode::addChild(local_98,node);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    value = value + VK_FORMAT_R4G4_UNORM_PACK8;
  } while (value != (VK_FORMAT_ASTC_12x12_SRGB_BLOCK|VK_FORMAT_R4G4_UNORM_PACK8));
  return;
}

Assistant:

void createImageFormatTypeTilingTests (tcu::TestCaseGroup* testGroup, ImageFormatPropertyCase params)
{
	DE_ASSERT(params.format == VK_FORMAT_UNDEFINED);

	for (deUint32 formatNdx = VK_FORMAT_UNDEFINED+1; formatNdx < VK_CORE_FORMAT_LAST; ++formatNdx)
	{
		const VkFormat		format			= (VkFormat)formatNdx;
		const char* const	enumName		= getFormatName(format);
		const string		caseName		= de::toLower(string(enumName).substr(10));

		params.format = format;

		addFunctionCase(testGroup, caseName, enumName, execImageFormatTest, params);
	}
}